

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall CLPIParser::parseSequenceInfo(CLPIParser *this,uint8_t *buffer,uint8_t *end)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t stc_id;
  char local_58;
  BitStreamReader reader;
  
  reader.super_BitStream.m_totalBits = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  BitStreamReader::setBuffer(&reader,buffer,end);
  BitStreamReader::skipBits(&reader,0x20);
  BitStreamReader::skipBits(&reader,8);
  uVar2 = BitStreamReader::getBits(&reader,8);
  for (cVar1 = '\0'; local_58 = (char)uVar2, cVar1 != local_58; cVar1 = cVar1 + '\x01') {
    BitStreamReader::skipBits(&reader,0x20);
    uVar3 = BitStreamReader::getBits(&reader,8);
    uVar4 = BitStreamReader::getBits(&reader,8);
    uVar6 = uVar4 & 0xff;
    for (; (uVar4 & 0xff) < uVar6 + (uVar3 & 0xff); uVar4 = (uint)(byte)((char)uVar4 + 1)) {
      BitStreamReader::skipBits(&reader,0x10);
      BitStreamReader::skipBits(&reader,0x20);
      uVar5 = BitStreamReader::getBits(&reader,0x20);
      this->presentation_start_time = uVar5;
      uVar5 = BitStreamReader::getBits(&reader,0x20);
      this->presentation_end_time = uVar5;
    }
  }
  return;
}

Assistant:

void CLPIParser::parseSequenceInfo(uint8_t* buffer, const uint8_t* end)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    reader.skipBits(32);                                              // length
    reader.skipBits(8);                                               // reserved_for_word_align
    const auto number_of_ATC_sequences = reader.getBits<uint8_t>(8);  // 1 is tipical value
    for (uint8_t atc_id = 0; atc_id < number_of_ATC_sequences; atc_id++)
    {
        reader.skipBits(32);  // SPN_ATC_start, 0 is tipical value
        const auto number_of_STC_sequences = reader.getBits<uint8_t>(8);
        const auto offset_STC_id = reader.getBits<uint8_t>(8);
        for (uint8_t stc_id = offset_STC_id; stc_id < number_of_STC_sequences + offset_STC_id; stc_id++)
        {
            reader.skipBits(16);  // PCR_PID
            reader.skipBits(32);  // SPN_STC_start
            presentation_start_time = reader.getBits(32);
            presentation_end_time = reader.getBits(32);
        }
    }
}